

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b_rle.h
# Opt level: O2

uint32_t FastPForLib::Simple8b_Codec::Decompress
                   (uint64_t *input,uint32_t param_2,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t repeatValue;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar5 = outCount + outOffset;
  uVar1 = 0;
  while( true ) {
    uVar8 = uVar5 - outOffset;
    if (uVar5 < outOffset || uVar8 == 0) {
      return uVar1;
    }
    uVar7 = input[uVar1];
    uVar1 = uVar1 + 1;
    if (uVar7 >> 0x3c == 0) break;
    uVar3 = (uint)(uVar7 >> 0x20);
    uVar2 = uVar3 >> 0x1c;
    if (uVar2 == 0xf) {
      uVar3 = uVar3 & 0xfffffff;
      if (uVar8 <= uVar3) {
        uVar3 = uVar8;
      }
      while (bVar11 = uVar3 != 0, uVar3 = uVar3 - 1, bVar11) {
        uVar4 = (ulong)outOffset;
        outOffset = outOffset + 1;
        output[uVar4] = (uint32_t)uVar7;
      }
    }
    else {
      uVar4 = (ulong)*(uint *)(Simple8b_Codec_bitLength + (uVar7 >> 0x3c) * 4);
      uVar3 = ~(uint)(-1L << (uVar4 & 0x3f));
      if (*(uint *)(Simple8b_Codec_bitLength + (ulong)(uVar2 ^ 0xf) * 4) < uVar8) {
        uVar8 = *(uint *)(Simple8b_Codec_bitLength + (ulong)(uVar2 ^ 0xf) * 4);
      }
      for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 8) {
        uVar6 = uVar7 >> (uVar4 & 0x3f);
        output[outOffset + uVar10] = (uint)uVar7 & uVar3;
        uVar9 = uVar6 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 1] = (uint)uVar6 & uVar3;
        uVar7 = uVar9 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 2] = (uint)uVar9 & uVar3;
        uVar6 = uVar7 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 3] = (uint)uVar7 & uVar3;
        uVar7 = uVar6 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 4] = (uint)uVar6 & uVar3;
        uVar9 = uVar7 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 5] = (uint)uVar7 & uVar3;
        uVar6 = uVar9 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 6] = (uint)uVar9 & uVar3;
        uVar7 = uVar6 >> (uVar4 & 0x3f);
        output[(ulong)outOffset + uVar10 + 7] = (uint)uVar6 & uVar3;
      }
      for (; uVar10 < uVar8; uVar10 = uVar10 + 1) {
        uVar2 = (uint)uVar7;
        uVar7 = uVar7 >> (uVar4 & 0x3f);
        output[outOffset + uVar10] = uVar2 & uVar3;
      }
      outOffset = uVar8 + outOffset;
    }
  }
  return uVar1;
}

Assistant:

static uint32_t Decompress(const uint64_t *input, uint32_t,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = 0;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint64_t val = input[inPos++];
      uint32_t code = static_cast<uint32_t>(val >> SIMPLE8B_BITSIZE);

      // optional check for end-of-stream
      if (code == 0) {
        break; // end of stream
      }

#if defined(_SIMPLE8B_USE_RLE)
      else if (code == SIMPLE8B_MAXCODE) {
        // decode rle-encoded integers
        uint32_t repeatValue = static_cast<uint32_t>(val & RLE_MAX_VALUE_MASK);
        uint32_t repeatCount = static_cast<uint32_t>(
            (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK);
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple8b_Codec_bitLength[SIMPLE8B_MAXCODE - code];
        uint32_t bitLen = Simple8b_Codec_bitLength[code];
        uint64_t bitMask = (1ULL << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 8) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[1] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[2] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[3] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[4] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[5] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[6] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
          out[7] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = static_cast<uint32_t>(val & bitMask);
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }